

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints(MeshEdgebreakerEncoder *this)

{
  uint uVar1;
  MeshEdgebreakerEncoderImplInterface *pMVar2;
  pointer pIVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mesh *pMVar6;
  uint uVar7;
  pointer puVar8;
  uint uVar9;
  uint uVar10;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar11;
  ulong uVar12;
  bool bVar13;
  long lVar14;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
  attribute_corner_tables;
  MeshAttributeCornerTable *att_corner_table;
  MeshAttributeCornerTable **local_88;
  iterator iStack_80;
  MeshAttributeCornerTable **local_78;
  MeshEdgebreakerEncoder *local_68;
  size_t local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  MeshAttributeCornerTable *local_38;
  long lVar5;
  
  pMVar2 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl;
  if (pMVar2 != (MeshEdgebreakerEncoderImplInterface *)0x0) {
    iVar4 = (*pMVar2->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    lVar5 = CONCAT44(extraout_var,iVar4);
    if (lVar5 != 0) {
      sVar16 = (long)(int)((ulong)(*(long *)(lVar5 + 0x38) - *(long *)(lVar5 + 0x30)) >> 2) -
               (long)*(int *)(lVar5 + 0x50);
      pMVar6 = (this->super_MeshEncoder).mesh_;
      if (1 < (int)((ulong)((long)(pMVar6->super_PointCloud).attributes_.
                                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pMVar6->super_PointCloud).attributes_.
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        local_88 = (MeshAttributeCornerTable **)0x0;
        iStack_80._M_current = (MeshAttributeCornerTable **)0x0;
        local_78 = (MeshAttributeCornerTable **)0x0;
        pMVar6 = (this->super_MeshEncoder).mesh_;
        puVar8 = (pMVar6->super_PointCloud).attributes_.
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)(pMVar6->super_PointCloud).attributes_.
                                    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8) >> 3)
           ) {
          uVar18 = 0;
          do {
            if (*(int *)((long)puVar8[uVar18]._M_t.
                               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                               ._M_t + 0x38) != 0) {
              iVar4 = (*(this->super_MeshEncoder).super_PointCloudEncoder._vptr_PointCloudEncoder
                        [0xe])(this,uVar18 & 0xffffffff);
              local_38 = (MeshAttributeCornerTable *)CONCAT44(extraout_var_00,iVar4);
              if (local_38 != (MeshAttributeCornerTable *)0x0) {
                if (iStack_80._M_current == local_78) {
                  std::
                  vector<draco::MeshAttributeCornerTable_const*,std::allocator<draco::MeshAttributeCornerTable_const*>>
                  ::_M_realloc_insert<draco::MeshAttributeCornerTable_const*const&>
                            ((vector<draco::MeshAttributeCornerTable_const*,std::allocator<draco::MeshAttributeCornerTable_const*>>
                              *)&local_88,iStack_80,&local_38);
                }
                else {
                  *iStack_80._M_current = local_38;
                  iStack_80._M_current = iStack_80._M_current + 1;
                }
              }
            }
            uVar18 = uVar18 + 1;
            pMVar6 = (this->super_MeshEncoder).mesh_;
            puVar8 = (pMVar6->super_PointCloud).attributes_.
                     super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while ((long)uVar18 <
                   (long)(int)((ulong)((long)(pMVar6->super_PointCloud).attributes_.
                                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar8) >> 3));
        }
        local_50 = *(long *)(lVar5 + 0x30);
        uVar18 = (ulong)(*(long *)(lVar5 + 0x38) - local_50) >> 2;
        if ((int)uVar18 != 0) {
          local_40 = (long)iStack_80._M_current - (long)local_88 >> 3;
          local_58 = uVar18 & 0xffffffff;
          uVar18 = 0;
          sVar17 = sVar16;
          do {
            uVar1 = *(uint *)(local_50 + uVar18 * 4);
            sVar16 = sVar17;
            if (uVar1 != 0xffffffff) {
              if ((int)uVar1 < 0) {
                IVar15.value_ = 0xffffffff;
              }
              else {
                IVar15.value_ =
                     (pMVar6->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 / 3]._M_elems[uVar1 % 3]
                     .value_;
              }
              uVar7 = ((uVar1 * -0x55555555 < 0x55555556) - 1 | 2) + uVar1;
              if (uVar7 != 0xffffffff) {
                uVar7 = *(uint *)(*(long *)(lVar5 + 0x18) + (ulong)uVar7 * 4);
              }
              if (uVar7 != 0xffffffff) {
                uVar7 = uVar7 + ((uVar7 * -0x55555555 < 0x55555556) - 1 | 2);
              }
              lVar14 = 0;
              uVar9 = uVar1;
              do {
                if (uVar7 == 0xffffffff) break;
                if ((int)uVar7 < 0) {
                  IVar11.value_ = 0xffffffff;
                }
                else {
                  IVar11.value_ =
                       (pMVar6->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar7 / 3]._M_elems
                       [uVar7 % 3].value_;
                }
                if (IVar11.value_ != IVar15.value_ ||
                    (long)iStack_80._M_current - (long)local_88 == 0) {
                  bVar13 = IVar11.value_ != IVar15.value_ || iStack_80._M_current != local_88;
                  IVar15.value_ = IVar11.value_;
                }
                else {
                  uVar12 = 0;
                  do {
                    pIVar3 = (local_88[uVar12]->corner_to_vertex_map_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (pIVar3[uVar7].value_ != pIVar3[uVar9].value_) {
                      bVar13 = true;
                      goto LAB_00139e65;
                    }
                    uVar12 = uVar12 + 1;
                  } while (local_40 + (local_40 == 0) != uVar12);
                  bVar13 = uVar12 < local_40;
                }
LAB_00139e65:
                uVar10 = uVar7;
                if (uVar7 != uVar1) {
                  uVar10 = ((uVar7 * -0x55555555 < 0x55555556) - 1 | 2) + uVar7;
                  if (uVar10 != 0xffffffff) {
                    uVar10 = *(uint *)(*(long *)(lVar5 + 0x18) + (ulong)uVar10 * 4);
                  }
                  uVar9 = uVar7;
                  if (uVar10 != 0xffffffff) {
                    uVar10 = uVar10 + ((uVar10 * -0x55555555 < 0x55555556) - 1 | 2);
                  }
                }
                lVar14 = lVar14 + (ulong)bVar13;
                bVar13 = uVar7 != uVar1;
                uVar7 = uVar10;
              } while (bVar13);
              uVar7 = uVar1 - 2;
              if (0x55555555 < (uVar1 + 1) * -0x55555555) {
                uVar7 = uVar1 + 1;
              }
              if (uVar7 != 0xffffffff) {
                uVar7 = *(uint *)(*(long *)(lVar5 + 0x18) + (ulong)uVar7 * 4);
              }
              if (uVar7 == 0xffffffff) {
                bVar13 = false;
              }
              else {
                iVar4 = uVar7 - 2;
                if (0x55555555 < (uVar7 + 1) * -0x55555555) {
                  iVar4 = uVar7 + 1;
                }
                bVar13 = iVar4 != -1;
              }
              sVar16 = (sVar17 + lVar14) - (ulong)(byte)(lVar14 != 0 & bVar13);
              local_60 = sVar17;
              local_48 = uVar18;
            }
            uVar18 = uVar18 + 1;
            sVar17 = sVar16;
            local_68 = this;
          } while (uVar18 != local_58);
        }
        if (local_88 != (MeshAttributeCornerTable **)0x0) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
      }
      (this->super_MeshEncoder).super_PointCloudEncoder.num_encoded_points_ = sVar16;
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints() {
  if (!impl_) {
    return;
  }
  const CornerTable *const corner_table = impl_->GetCornerTable();
  if (!corner_table) {
    return;
  }
  size_t num_points =
      corner_table->num_vertices() - corner_table->NumIsolatedVertices();

  if (mesh()->num_attributes() > 1) {
    // Gather all corner tables for all non-position attributes.
    std::vector<const MeshAttributeCornerTable *> attribute_corner_tables;
    for (int i = 0; i < mesh()->num_attributes(); ++i) {
      if (mesh()->attribute(i)->attribute_type() ==
          GeometryAttribute::POSITION) {
        continue;
      }
      const MeshAttributeCornerTable *const att_corner_table =
          GetAttributeCornerTable(i);
      // Attribute corner table may not be used in some configurations. For
      // these cases we can assume the attribute connectivity to be the same as
      // the connectivity of the position data.
      if (att_corner_table) {
        attribute_corner_tables.push_back(att_corner_table);
      }
    }

    // Add a new point based on the configuration of interior attribute seams
    // (replicating what the decoder would do).
    for (VertexIndex vi(0); vi < corner_table->num_vertices(); ++vi) {
      if (corner_table->IsVertexIsolated(vi)) {
        continue;
      }
      // Go around all corners of the vertex and keep track of the observed
      // attribute seams.
      const CornerIndex first_corner_index = corner_table->LeftMostCorner(vi);
      const PointIndex first_point_index =
          mesh()->CornerToPointId(first_corner_index);

      PointIndex last_point_index = first_point_index;
      CornerIndex last_corner_index = first_corner_index;
      CornerIndex corner_index = corner_table->SwingRight(first_corner_index);
      size_t num_attribute_seams = 0;
      while (corner_index != kInvalidCornerIndex) {
        const PointIndex point_index = mesh()->CornerToPointId(corner_index);
        bool seam_found = false;
        if (point_index != last_point_index) {
          // Point index changed - new attribute seam detected.
          seam_found = true;
          last_point_index = point_index;
        } else {
          // Even though point indices matches, there still may be a seam caused
          // by non-manifold connectivity of non-position attribute data.
          for (int i = 0; i < attribute_corner_tables.size(); ++i) {
            if (attribute_corner_tables[i]->Vertex(corner_index) !=
                attribute_corner_tables[i]->Vertex(last_corner_index)) {
              seam_found = true;
              break;  // No need to process other attributes.
            }
          }
        }
        if (seam_found) {
          ++num_attribute_seams;
        }

        if (corner_index == first_corner_index) {
          break;
        }

        // Proceed to the next corner
        last_corner_index = corner_index;
        corner_index = corner_table->SwingRight(corner_index);
      }

      if (!corner_table->IsOnBoundary(vi) && num_attribute_seams > 0) {
        // If the last visited point index is the same as the first point index
        // we traveled all the way around the vertex. In this case the number of
        // new points should be num_attribute_seams - 1
        num_points += num_attribute_seams - 1;
      } else {
        // Else the vertex was either on a boundary (i.e. we couldn't travel all
        // around the vertex), or we ended up at a different point. In both of
        // these cases, the number of new points is equal to the number of
        // attribute seams.
        num_points += num_attribute_seams;
      }
    }
  }
  set_num_encoded_points(num_points);
}